

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionEvaluator.cpp
# Opt level: O1

bool __thiscall
OpenMD::SelectionEvaluator::loadScriptString(SelectionEvaluator *this,string *script)

{
  bool bVar1;
  char *__end;
  string local_48;
  
  this->error = false;
  std::__cxx11::string::_M_replace
            ((ulong)&this->errorMessage,0,(char *)(this->errorMessage)._M_string_length,0x211119);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"","");
  bVar1 = loadScript(this,&local_48,script);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return bVar1;
}

Assistant:

bool SelectionEvaluator::loadScriptString(const std::string& script) {
    clearState();
    return loadScript("", script);
  }